

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O3

void __thiscall BPlusTree::PrintRecordsInNode(BPlusTree *this,shared_ptr<Node> *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer psVar3;
  ulong uVar4;
  long lVar5;
  shared_ptr<void> local_40;
  
  peVar2 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar3 = (peVar2->ptrs).
           super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((peVar2->ptrs).
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar3) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)((long)psVar3 + lVar5 + -8);
      local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(psVar3->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar5);
      if ((BPlusTree *)
          local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (BPlusTree *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(((BPlusTree *)
                     local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     )->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
          peVar2 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        else {
          p_Var1 = &(((BPlusTree *)
                     local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     )->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
      PrintRecordOfKey(this,&local_40,
                       (peVar2->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4]);
      if ((BPlusTree *)
          local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (BPlusTree *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      uVar4 = uVar4 + 1;
      peVar2 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar3 = (peVar2->ptrs).
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
      this = (BPlusTree *)
             local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    } while (uVar4 < (ulong)((long)(peVar2->ptrs).
                                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  return;
}

Assistant:

void BPlusTree::PrintRecordsInNode(std::shared_ptr<Node> node) {
    for (int i = 0; i < node->ptrs.size(); i++) {
        PrintRecordOfKey(node->ptrs[i], node->keys[i]);
    }
}